

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O0

int __thiscall
bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::copy
          (left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  buf_type *pbVar5;
  undefined7 extraout_var;
  buf_type *pbVar6;
  buf_type *pbVar7;
  void *pvVar8;
  size_type os;
  int iVar4;
  
  sVar3 = detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::raw_size
                    ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)dst);
  if (sVar3 == 0) {
    pbVar5 = detail::no_inline_buffer<Clasp::ClauseWatch,_Clasp::GenericWatch>::extra
                       (&this->super_type);
    (this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ = pbVar5;
    *(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
              field_0x8 =
         *(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                   field_0x8 & 0x80000000;
    *(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
              field_0x8 =
         *(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                   field_0x8 & 0x7fffffff;
  }
  else {
    pbVar6 = (buf_type *)operator_new((ulong)(sVar3 + 0xf & 0xfffffff0));
    (this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ = pbVar6;
    *(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
              field_0x8 =
         *(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                   field_0x8 & 0x80000000 | sVar3 + 0xf & 0x7ffffff0;
    *(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
              field_0x8 =
         *(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                   field_0x8 & 0x7fffffff | 0x80000000;
  }
  (this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_ =
       *(size_type *)(dst + 0xc);
  uVar1 = *(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>
                    .field_0x8;
  sVar3 = detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_size
                    ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)dst);
  (this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ =
       (uVar1 & 0x7fffffff) + sVar3 * -0x10;
  bVar2 = detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::empty
                    ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)dst);
  iVar4 = (int)CONCAT71(extraout_var,bVar2);
  if (!bVar2) {
    pbVar6 = detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::begin
                       ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)this);
    pbVar7 = detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::begin
                       ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)dst);
    sVar3 = detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_size
                      ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)dst);
    memcpy(pbVar6,pbVar7,(ulong)sVar3 << 3);
    pbVar6 = detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right
                       ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)this);
    pbVar7 = detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right
                       ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)dst);
    sVar3 = detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_size
                      ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)dst);
    pvVar8 = memcpy(pbVar6,pbVar7,(ulong)sVar3 << 4);
    iVar4 = (int)pvVar8;
  }
  return iVar4;
}

Assistant:

void left_right_sequence<L, R, i>::copy(const left_right_sequence& other) {
	size_type os = other.raw_size();
	if ( os <= base_type::inline_raw_cap ) {
		this->buf_ = this->extra();
		this->cap_ = base_type::inline_raw_cap;
		this->free_= 0;
	}
	else {
		os         = ((os + (base_type::block_size-1)) / base_type::block_size) * base_type::block_size;
		this->buf_ = (buf_type*)::operator new(os*sizeof(buf_type));
		this->cap_ = os;
		this->free_= 1;
	}
	this->left_ = other.left_;
	this->right_= this->cap_ - (other.right_size()*sizeof(right_type));
	if (!other.empty()) {
		std::memcpy(this->begin(), other.begin(), other.left_size()*sizeof(left_type));
		std::memcpy(this->right(), const_cast<left_right_sequence&>(other).right(), other.right_size()*sizeof(right_type));
	}
}